

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O0

string * __thiscall
Dashel::IPV4Address::hostname_abi_cxx11_(string *__return_storage_ptr__,IPV4Address *this)

{
  char *pcVar1;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  in_addr_t local_30;
  in_addr_t local_2c;
  hostent *phStack_28;
  in_addr addr;
  hostent *he;
  IPV4Address *pIStack_18;
  uint a2;
  IPV4Address *this_local;
  
  pIStack_18 = this;
  this_local = (IPV4Address *)__return_storage_ptr__;
  he._4_4_ = htonl(this->address);
  phStack_28 = gethostbyaddr((void *)((long)&he + 4),4,2);
  if (phStack_28 == (hostent *)0x0) {
    local_2c = he._4_4_;
    local_30 = he._4_4_;
    pcVar1 = inet_ntoa(he._4_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1,&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    pcVar1 = phStack_28->h_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1,local_45);
    std::allocator<char>::~allocator(local_45);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IPV4Address::hostname() const
	{
		unsigned a2 = htonl(address);
		struct hostent* he = gethostbyaddr((const char*)&a2, 4, AF_INET);

		if (he == NULL)
		{
			struct in_addr addr;
			addr.s_addr = a2;
			return std::string(inet_ntoa(addr));
		}
		else
		{
			return std::string(he->h_name);
		}
	}